

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::ClockingItemSyntax::ClockingItemSyntax
          (ClockingItemSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          ClockingDirectionSyntax *direction,
          SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *decls,Token semi)

{
  size_type sVar1;
  pointer ppAVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  AttributeSpecSyntax *pAVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  size_t index;
  
  uVar6 = semi._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.kind = ClockingItem;
  SVar3 = (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .size_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       data_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004ea348;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar7 = 0;
    do {
      **(undefined8 **)((long)ppAVar2 + lVar7) = this;
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  (this->direction).ptr = direction;
  SVar3 = (decls->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(decls->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->decls).super_SyntaxListBase.super_SyntaxNode.parent =
       (decls->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->decls).super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(this->decls).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->decls).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this->decls).super_SyntaxListBase.childCount = (decls->super_SyntaxListBase).childCount;
  (this->decls).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004ecdf0;
  sVar1 = (decls->elements).size_;
  (this->decls).elements.data_ = (decls->elements).data_;
  (this->decls).elements.size_ = sVar1;
  (this->semi).kind = (short)uVar6;
  (this->semi).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->semi).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->semi).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->semi).info = semi.info;
  (direction->super_SyntaxNode).parent = (SyntaxNode *)this;
  (this->decls).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar8 = (this->decls).elements.size_ + 1;
  if (1 < uVar8) {
    index = 0;
    do {
      pAVar5 = SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::operator[]
                         (&this->decls,index);
      (pAVar5->super_SyntaxNode).parent = (SyntaxNode *)this;
      index = index + 1;
    } while (uVar8 >> 1 != index);
  }
  return;
}

Assistant:

ClockingItemSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, ClockingDirectionSyntax& direction, const SeparatedSyntaxList<AttributeSpecSyntax>& decls, Token semi) :
        MemberSyntax(SyntaxKind::ClockingItem, attributes), direction(&direction), decls(decls), semi(semi) {
        this->direction->parent = this;
        this->decls.parent = this;
        for (auto child : this->decls)
            child->parent = this;
    }